

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_dbg.c
# Opt level: O1

void log_line_start(FILE *log,char *timebuf,char *idsbuf,curl_infotype type)

{
  if (((timebuf == (char *)0x0) || (*timebuf == '\0')) &&
     ((idsbuf == (char *)0x0 || (*idsbuf == '\0')))) {
    fputs(log_line_start::s_infotype[type],(FILE *)log);
    return;
  }
  curl_mfprintf(log,"%s%s%s",timebuf,idsbuf,log_line_start::s_infotype[type]);
  return;
}

Assistant:

static void log_line_start(FILE *log, const char *timebuf,
                           const char *idsbuf, curl_infotype type)
{
  /*
   * This is the trace look that is similar to what libcurl makes on its
   * own.
   */
  static const char * const s_infotype[] = {
    "* ", "< ", "> ", "{ ", "} ", "{ ", "} "
  };
  if((timebuf && *timebuf) || (idsbuf && *idsbuf))
    fprintf(log, "%s%s%s", timebuf, idsbuf, s_infotype[type]);
  else
    fputs(s_infotype[type], log);
}